

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsimd_generic_trigo.hpp
# Opt level: O0

batch<float,_xsimd::avx512bw> *
xsimd::kernel::asin<xsimd::avx512bw>
          (batch<float,_xsimd::avx512bw> *self,requires_arch<generic> param_2)

{
  undefined1 auVar1 [28];
  batch<float,_xsimd::avx512bw> *pbVar2;
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  batch_type z1;
  batch_type z;
  batch_bool<float,_xsimd::avx512bw> x_larger_05;
  batch_type sign;
  batch_type x;
  batch<float,_xsimd::avx512bw> *pbVar6;
  batch<float,_xsimd::avx512bw> *true_br;
  batch<float,_xsimd::avx512bw> *x_00;
  undefined1 in_stack_fffffffffffffa40 [64];
  float val;
  undefined1 auVar7 [28];
  batch<float,_xsimd::avx512bw> *other;
  batch<float,_xsimd::avx512bw> *self_00;
  undefined1 auVar10 [16];
  undefined1 in_stack_fffffffffffffac0 [64];
  undefined1 auVar8 [40];
  undefined1 auVar9 [52];
  undefined1 auVar11 [40];
  undefined1 auVar12 [52];
  batch<float,_xsimd::avx512bw> *local_500 [6];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined1 local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_300 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  batch<float,_xsimd::avx512bw> local_200;
  get_bool_simd_register_t<float,_xsimd::avx512bw> local_182;
  batch<float,_xsimd::avx512bw> local_140 [4];
  
  x_00 = in_stack_fffffffffffffa40._48_8_;
  pbVar2 = local_500[0];
  auVar12 = in_stack_fffffffffffffac0._40_52_;
  abs<float,xsimd::avx512bw>(x_00);
  auVar9 = auVar12;
  bitofsign<float,xsimd::avx512bw>(x_00);
  batch<float,_xsimd::avx512bw>::batch(pbVar6,val);
  auVar8 = auVar11;
  local_182.data = (register_type)operator>(local_140,&local_200);
  auVar1 = auVar8._12_28_;
  batch<float,_xsimd::avx512bw>::batch(pbVar6,val);
  auVar7 = auVar1;
  auVar3 = ZEXT464(0x3f800000);
  batch<float,_xsimd::avx512bw>::batch(pbVar6,val);
  xsimd::operator-(self_00,other);
  local_300 = auVar3;
  xsimd::operator*(self_00,other);
  local_280 = auVar3;
  xsimd::operator*(self_00,other);
  true_br = in_stack_fffffffffffffa40._40_8_;
  pbVar6 = in_stack_fffffffffffffa40._32_8_;
  local_380 = auVar3;
  select<float,xsimd::avx512bw>((batch_bool<float,_xsimd::avx512bw> *)x_00,true_br,pbVar6);
  local_240 = auVar3;
  sqrt<float,xsimd::avx512bw>(x_00);
  local_400 = auVar3;
  select<float,xsimd::avx512bw>((batch_bool<float,_xsimd::avx512bw> *)x_00,true_br,pbVar6);
  auVar4 = ZEXT1664(auVar3._0_16_);
  local_3c0 = auVar3;
  memcpy(local_140,local_3c0,0x40);
  detail::
  horner<xsimd::batch<float,xsimd::avx512bw>,1042983652ul,1033470198ul,1027227335ul,1019615203ul,1026339666ul>
            (pbVar2);
  local_440 = auVar4;
  xsimd::operator*(self_00,other);
  fma<float,xsimd::avx512bw>(x_00,true_br,pbVar6);
  auVar5 = ZEXT1664(auVar4._0_16_);
  local_480 = auVar4;
  memcpy(local_440,local_480,0x40);
  constants::pio2<xsimd::batch<float,xsimd::avx512bw>>();
  xsimd::operator+(self_00,other);
  auVar3 = auVar5;
  xsimd::operator-(self_00,other);
  auVar10 = auVar3._40_16_;
  select<float,xsimd::avx512bw>(auVar5._48_8_,auVar5._40_8_,auVar5._32_8_);
  _local_500 = auVar3;
  memcpy(local_240,local_500,0x40);
  pbVar2 = operator^(self_00,other);
  return pbVar2;
}

Assistant:

inline batch<float, A> asin(batch<float, A> const& self, requires_arch<generic>) noexcept
        {
            using batch_type = batch<float, A>;
            batch_type x = abs(self);
            batch_type sign = bitofsign(self);
            auto x_larger_05 = x > batch_type(0.5);
            batch_type z = select(x_larger_05, batch_type(0.5) * (batch_type(1.) - x), x * x);
            x = select(x_larger_05, sqrt(z), x);
            batch_type z1 = detail::horner<batch_type,
                                           0x3e2aaae4,
                                           0x3d9980f6,
                                           0x3d3a3ec7,
                                           0x3cc617e3,
                                           0x3d2cb352>(z);
            z1 = fma(z1, z * x, x);
            z = select(x_larger_05, constants::pio2<batch_type>() - (z1 + z1), z1);
            return z ^ sign;
        }